

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

int Saig_SynchSavePattern
              (Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords,int iPat,Vec_Str_t *vSequence)

{
  byte bVar1;
  uint uVar2;
  void *pvVar3;
  char *__ptr;
  ulong uVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (nWords * 0x10 <= iPat) {
    __assert_fail("iPat < 16 * nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                  ,0x147,
                  "int Saig_SynchSavePattern(Aig_Man_t *, Vec_Ptr_t *, int, int, Vec_Str_t *)");
  }
  bVar1 = (char)iPat * '\x02';
  for (iVar9 = 0; iVar9 < pAig->nTruePis; iVar9 = iVar9 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,iVar9);
    pvVar3 = Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar3 + 0x24));
    uVar8 = *(uint *)((long)pvVar3 + (long)(iPat >> 4) * 4);
    iVar7 = vSequence->nSize;
    if (iVar7 == vSequence->nCap) {
      uVar2 = iVar7 * 2;
      if (iVar7 < 0x10) {
        uVar2 = 0x10;
      }
      __ptr = vSequence->pArray;
      if (iVar7 < (int)uVar2) {
        if (__ptr == (char *)0x0) {
          __ptr = (char *)malloc((ulong)uVar2);
        }
        else {
          __ptr = (char *)realloc(__ptr,(ulong)uVar2);
          iVar7 = vSequence->nSize;
        }
        vSequence->pArray = __ptr;
        vSequence->nCap = uVar2;
      }
    }
    else {
      __ptr = vSequence->pArray;
    }
    vSequence->nSize = iVar7 + 1;
    __ptr[iVar7] = (byte)(uVar8 >> (bVar1 & 0x1e)) & 3;
  }
  uVar4 = 0;
  uVar11 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar11 = uVar4;
  }
  for (iVar9 = 0; iVar9 < pAig->nRegs; iVar9 = iVar9 + 1) {
    pAVar5 = Saig_ManLi(pAig,iVar9);
    pAVar6 = Saig_ManLo(pAig,iVar9);
    pvVar3 = Vec_PtrEntry(vSimInfo,pAVar5->Id);
    uVar8 = *(uint *)((long)pvVar3 + (long)(iPat >> 4) * 4) >> (bVar1 & 0x1e) & 3;
    pvVar3 = Vec_PtrEntry(vSimInfo,pAVar6->Id);
    for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      uVar2 = Saig_SynchTernary(uVar8);
      *(uint *)((long)pvVar3 + uVar10 * 4) = uVar2;
    }
    uVar4 = (ulong)((int)uVar4 + (uint)(uVar8 == 3));
  }
  return (int)uVar4;
}

Assistant:

int Saig_SynchSavePattern( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords, int iPat, Vec_Str_t * vSequence )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    unsigned * pSim;
    int Counter, Value, i, w;
    assert( iPat < 16 * nWords );
    Saig_ManForEachPi( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        Value = (pSim[iPat>>4] >> ((iPat&0xf) << 1)) & 3;
        Vec_StrPush( vSequence, (char)Value );
//        printf( "%d ", Value );
    }
//    printf( "\n" );
    Counter = 0;
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLi->Id );
        Value = (pSim[iPat>>4] >> ((iPat&0xf) << 1)) & 3;
        Counter += (Value == 3);
        // save patern in the same register
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLo->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = Saig_SynchTernary( Value );
    }
    return Counter;
}